

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

float Abc_NtkMfsTotalSwitching(Abc_Ntk_t *pNtk)

{
  int *piVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  Aig_Man_t *pAig_00;
  Vec_Int_t *p;
  Abc_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_50;
  float local_4c;
  int i;
  float Result;
  Abc_Obj_t *pObjAbc2;
  Abc_Obj_t *pObjAbc;
  Aig_Obj_t *pObjAig;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pNtkStr;
  float *pSwitching;
  Vec_Int_t *vSwitching;
  Abc_Ntk_t *pNtk_local;
  
  local_4c = 0.0;
  pNtk_00 = Abc_NtkStrash(pNtk,0,1,0);
  for (local_50 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_50 < iVar2; local_50 = local_50 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,local_50);
    if ((pAVar3 != (Abc_Obj_t *)0x0) &&
       ((pAVar4 = Abc_ObjRegular((pAVar3->field_6).pCopy), (*(uint *)&pAVar4->field_0x14 & 0xf) == 0
        || ((iVar2 = Abc_ObjIsCi(pAVar3), iVar2 == 0 && (iVar2 = Abc_ObjIsNode(pAVar3), iVar2 == 0))
           )))) {
      (pAVar3->field_6).pTemp = (void *)0x0;
    }
  }
  iVar2 = Abc_NtkLatchNum(pNtk);
  pAig_00 = Abc_NtkToDar(pNtk_00,0,(uint)(0 < iVar2));
  p = Saig_ManComputeSwitchProbs(pAig_00,0x30,0x10,0);
  piVar1 = p->pArray;
  for (local_50 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_50 < iVar2; local_50 = local_50 + 1) {
    pAVar3 = Abc_NtkObj(pNtk,local_50);
    if (((pAVar3 != (Abc_Obj_t *)0x0) &&
        (pAVar4 = Abc_ObjRegular((pAVar3->field_6).pCopy), pAVar4 != (Abc_Obj_t *)0x0)) &&
       (pAVar5 = Aig_Regular((Aig_Obj_t *)(pAVar4->field_6).pCopy), pAVar5 != (Aig_Obj_t *)0x0)) {
      iVar2 = Abc_ObjFanoutNum(pAVar3);
      local_4c = (float)iVar2 * (float)piVar1[pAVar5->Id] + local_4c;
    }
  }
  Vec_IntFree(p);
  Aig_ManStop(pAig_00);
  Abc_NtkDelete(pNtk_00);
  return local_4c;
}

Assistant:

float Abc_NtkMfsTotalSwitching( Abc_Ntk_t * pNtk )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Abc_Ntk_t * pNtkStr;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Abc_Obj_t * pObjAbc, * pObjAbc2;
    float Result = (float)0;
    int i;
    // strash the network
    pNtkStr = Abc_NtkStrash( pNtk, 0, 1, 0 );
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
        if ( Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)->Type == ABC_FUNC_NONE || (!Abc_ObjIsCi(pObjAbc) && !Abc_ObjIsNode(pObjAbc)) )
            pObjAbc->pTemp = NULL;
    // map network into an AIG
    pAig = Abc_NtkToDar( pNtkStr, 0, (int)(Abc_NtkLatchNum(pNtk) > 0) );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, 0 );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAbc2 = Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)) && (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc2->pTemp)) )
        {
            Result += Abc_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id];
//            Abc_ObjPrint( stdout, pObjAbc );
//            printf( "%d = %.2f\n", i, Abc_ObjFanoutNum(pObjAbc) * pSwitching[pObjAig->Id] );
        }
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    Abc_NtkDelete( pNtkStr );
    return Result;
}